

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_smartAlloc.cpp
# Opt level: O3

double ** __thiscall
PP_smartAlloc::allocateDouble(PP_smartAlloc *this,unsigned_long _Nt,unsigned_long _Nz)

{
  double **ppdVar1;
  double *pdVar2;
  unsigned_long uVar3;
  ulong uVar4;
  
  ppdVar1 = (double **)operator_new__(-(ulong)(_Nt >> 0x3d != 0) | _Nt * 8);
  if (_Nt != 0) {
    uVar4 = 0xffffffffffffffff;
    if (_Nz < 0x2000000000000000) {
      uVar4 = _Nz * 8;
    }
    uVar3 = 0;
    do {
      pdVar2 = (double *)operator_new__(uVar4);
      ppdVar1[uVar3] = pdVar2;
      uVar3 = uVar3 + 1;
    } while (_Nt != uVar3);
  }
  return ppdVar1;
}

Assistant:

double ** PP_smartAlloc::allocateDouble(unsigned long _Nt, unsigned long _Nz)
{
    double** _M = new double*[_Nt];
    if(_M!=NULL)
    {
        unsigned long I = _Nt+1;
        for(unsigned long i=0 ; i<_Nt ; i++)
        {
            _M[i] = new double[_Nz];
            if(_M[i]==NULL)
            {
                I=i;
                i=_Nt;
            }
        }
        if(I!=(_Nt+1))
        {
            for(unsigned long i=0 ; i<I ; i++)
            {
                delete _M[i];
            }
            delete _M;
            _M = NULL;
        }
    }
    return _M;
}